

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>
          (AssertionExpr *this,MonitorVisitor *visitor)

{
  logic_error *this_00;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(this->kind) {
  case Invalid:
    return;
  case Simple:
    SimpleAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((SimpleAssertionExpr *)this,visitor);
    return;
  case SequenceConcat:
    SequenceConcatExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((SequenceConcatExpr *)this,visitor);
    return;
  case SequenceWithMatch:
    SequenceWithMatchExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((SequenceWithMatchExpr *)this,visitor);
    return;
  case Unary:
    UnaryAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((UnaryAssertionExpr *)this,visitor);
    return;
  case Binary:
    BinaryAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((BinaryAssertionExpr *)this,visitor);
    return;
  case FirstMatch:
    FirstMatchAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((FirstMatchAssertionExpr *)this,visitor);
    return;
  case Clocking:
    ClockingAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ClockingAssertionExpr *)this,visitor);
    return;
  case StrongWeak:
    StrongWeakAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((StrongWeakAssertionExpr *)this,visitor);
    return;
  case Abort:
    AbortAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((AbortAssertionExpr *)this,visitor);
    return;
  case Conditional:
    ConditionalAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ConditionalAssertionExpr *)this,visitor);
    return;
  case Case:
    CaseAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((CaseAssertionExpr *)this,visitor);
    return;
  case DisableIff:
    DisableIffAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((DisableIffAssertionExpr *)this,visitor);
    return;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x199);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

decltype(auto) AssertionExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case AssertionExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case AssertionExprKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Simple, SimpleAssertionExpr);
        CASE(SequenceConcat, SequenceConcatExpr);
        CASE(SequenceWithMatch, SequenceWithMatchExpr);
        CASE(Unary, UnaryAssertionExpr);
        CASE(Binary, BinaryAssertionExpr);
        CASE(FirstMatch, FirstMatchAssertionExpr);
        CASE(Clocking, ClockingAssertionExpr);
        CASE(StrongWeak, StrongWeakAssertionExpr);
        CASE(Abort, AbortAssertionExpr);
        CASE(Conditional, ConditionalAssertionExpr);
        CASE(Case, CaseAssertionExpr);
        CASE(DisableIff, DisableIffAssertionExpr);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}